

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O2

void duckdb::ExecuteLambda<duckdb::ListTransformFunctor>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  optional_ptr<duckdb::Vector,_true> *this;
  bool has_index;
  reference_wrapper<duckdb::LambdaFunctions::ColumnInfo> *entry;
  reference pvVar1;
  UnifiedVectorFormat *pUVar2;
  Vector *pVVar3;
  ClientContext *context;
  Expression *lambda_expr;
  ulong uVar4;
  pointer prVar5;
  TemplatedValidityMask<unsigned_long> *this_00;
  long lVar6;
  ulong uVar7;
  Value *elem_cnt;
  ulong row_idx;
  list_entry_t *plVar8;
  bool result_is_null;
  Vector *local_2e8;
  long local_2e0;
  long local_2d8;
  vector<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_true> mutable_column_infos;
  LogicalType local_2b8 [24];
  LambdaInfo info;
  ListFilterInfo list_filter_info;
  ColumnInfo child_info;
  LambdaExecuteInfo execute_info;
  Vector index_vector;
  Value local_70 [64];
  
  result_is_null = false;
  LambdaFunctions::LambdaInfo::LambdaInfo(&info,args,state,result,&result_is_null);
  if (result_is_null == false) {
    local_2e0 = *(long *)(result + 0x20);
    LambdaFunctions::GetMutableColumnInfo(&mutable_column_infos,&info.column_infos);
    pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
    pUVar2 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(pvVar1);
    this = &info.child_vector;
    pVVar3 = optional_ptr<duckdb::Vector,_true>::operator*(this);
    LambdaFunctions::ColumnInfo::ColumnInfo(&child_info,pVVar3);
    pVVar3 = optional_ptr<duckdb::Vector,_true>::operator->(this);
    duckdb::Vector::ToUnifiedFormat((ulong)pVVar3,pUVar2);
    context = (ClientContext *)duckdb::ExpressionState::GetContext();
    lambda_expr = optional_ptr<duckdb::Expression,_true>::operator*(&info.lambda_expr);
    has_index = info.has_index;
    pVVar3 = optional_ptr<duckdb::Vector,_true>::operator*(this);
    LambdaExecuteInfo::LambdaExecuteInfo(&execute_info,context,lambda_expr,args,has_index,pVVar3);
    list_filter_info.offset = 0;
    list_filter_info.row_idx = 0;
    list_filter_info.entry_lengths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    list_filter_info.length = 0;
    list_filter_info.entry_lengths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    list_filter_info.entry_lengths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    list_filter_info.src_length = 0;
    duckdb::LogicalType::LogicalType(local_2b8,BIGINT);
    local_2e8 = result;
    duckdb::Vector::Vector(&index_vector,local_2b8,0x800);
    duckdb::LogicalType::~LogicalType(local_2b8);
    lVar6 = 0;
    elem_cnt = (Value *)0x0;
    for (row_idx = 0; row_idx < info.row_count; row_idx = row_idx + 1) {
      uVar4 = row_idx;
      if (*(long *)info._8_8_ != 0) {
        uVar4 = (ulong)*(uint *)(*(long *)info._8_8_ + row_idx * 4);
      }
      plVar8 = info.list_entries + uVar4;
      if ((info._24_8_ == 0) ||
         ((*(ulong *)(info._24_8_ + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0)) {
        *(long *)(local_2e0 + row_idx * 0x10) = lVar6;
        uVar4 = plVar8->length;
        *(ulong *)(local_2e0 + 8 + row_idx * 0x10) = uVar4;
        lVar6 = lVar6 + uVar4;
        if (uVar4 != 0) {
          local_2d8 = lVar6;
          for (uVar7 = 0; lVar6 = local_2d8, uVar7 < uVar4; uVar7 = uVar7 + 1) {
            if (elem_cnt == (Value *)0x800) {
              duckdb::DataChunk::Reset();
              ExecuteExpression(0x800,&child_info,&info.column_infos,&index_vector,&execute_info);
              pvVar1 = vector<duckdb::Vector,_true>::get<true>
                                 ((vector<duckdb::Vector,_true> *)&execute_info.lambda_chunk,0);
              duckdb::ListVector::Append(local_2e8,pvVar1,0x800,0);
              elem_cnt = (Value *)0x0;
            }
            child_info.sel.sel_vector[(long)elem_cnt] = (int)plVar8->offset + (int)uVar7;
            for (prVar5 = mutable_column_infos.
                          super_vector<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
                          .
                          super__Vector_base<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                prVar5 != mutable_column_infos.
                          super_vector<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
                          .
                          super__Vector_base<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish; prVar5 = prVar5 + 1) {
              (prVar5->_M_data->sel).sel_vector[(long)elem_cnt] = (sel_t)row_idx;
            }
            if (info.has_index != false) {
              NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar7 + 1);
              duckdb::Value::BIGINT((long)local_70);
              duckdb::Vector::SetValue((ulong)&index_vector,elem_cnt);
              duckdb::Value::~Value(local_70);
            }
            elem_cnt = elem_cnt + 1;
            uVar4 = plVar8->length;
          }
        }
      }
      else {
        this_00 = &optional_ptr<duckdb::ValidityMask,_true>::operator->(&info.result_validity)->
                   super_TemplatedValidityMask<unsigned_long>;
        TemplatedValidityMask<unsigned_long>::SetInvalid(this_00,row_idx);
      }
    }
    duckdb::DataChunk::Reset();
    ExecuteExpression((idx_t)elem_cnt,&child_info,&info.column_infos,&index_vector,&execute_info);
    pvVar1 = vector<duckdb::Vector,_true>::get<true>
                       ((vector<duckdb::Vector,_true> *)&execute_info.lambda_chunk,0);
    pVVar3 = local_2e8;
    duckdb::ListVector::Append(local_2e8,pvVar1,(ulong)elem_cnt,0);
    if ((info.is_all_constant == true) && (info.is_volatile == false)) {
      duckdb::Vector::SetVectorType((VectorType)pVVar3);
    }
    Vector::~Vector(&index_vector);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&list_filter_info);
    LambdaExecuteInfo::~LambdaExecuteInfo(&execute_info);
    LambdaFunctions::ColumnInfo::~ColumnInfo(&child_info);
    std::
    _Vector_base<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>,_std::allocator<std::reference_wrapper<duckdb::LambdaFunctions::ColumnInfo>_>_>
                     *)&mutable_column_infos);
  }
  LambdaFunctions::LambdaInfo::~LambdaInfo(&info);
  return;
}

Assistant:

void ExecuteLambda(DataChunk &args, ExpressionState &state, Vector &result) {

	bool result_is_null = false;
	LambdaFunctions::LambdaInfo info(args, state, result, result_is_null);
	if (result_is_null) {
		return;
	}

	auto result_entries = FlatVector::GetData<list_entry_t>(result);
	auto mutable_column_infos = LambdaFunctions::GetMutableColumnInfo(info.column_infos);

	// special-handling for the child_vector
	auto child_vector_size = ListVector::GetListSize(args.data[0]);
	LambdaFunctions::ColumnInfo child_info(*info.child_vector);
	info.child_vector->ToUnifiedFormat(child_vector_size, child_info.format);

	// get the expression executor
	LambdaExecuteInfo execute_info(state.GetContext(), *info.lambda_expr, args, info.has_index, *info.child_vector);

	// get list_filter specific info
	ListFilterInfo list_filter_info;
	FUNCTION_FUNCTOR::ReserveNewLengths(list_filter_info.entry_lengths, info.row_count);

	// additional index vector
	Vector index_vector(LogicalType::BIGINT);

	// loop over the child entries and create chunks to be executed by the expression executor
	idx_t elem_cnt = 0;
	idx_t offset = 0;
	for (idx_t row_idx = 0; row_idx < info.row_count; row_idx++) {

		auto list_idx = info.list_column_format.sel->get_index(row_idx);
		const auto &list_entry = info.list_entries[list_idx];

		// set the result to NULL for this row
		if (!info.list_column_format.validity.RowIsValid(list_idx)) {
			info.result_validity->SetInvalid(row_idx);
			FUNCTION_FUNCTOR::PushEmptyList(list_filter_info.entry_lengths);
			continue;
		}

		FUNCTION_FUNCTOR::SetResultEntry(result_entries, offset, list_entry, row_idx, list_filter_info.entry_lengths);

		// empty list, nothing to execute
		if (list_entry.length == 0) {
			continue;
		}

		// iterate the elements of the current list and create the corresponding selection vectors
		for (idx_t child_idx = 0; child_idx < list_entry.length; child_idx++) {

			// reached STANDARD_VECTOR_SIZE elements
			if (elem_cnt == STANDARD_VECTOR_SIZE) {

				execute_info.lambda_chunk.Reset();
				ExecuteExpression(elem_cnt, child_info, info.column_infos, index_vector, execute_info);
				auto &lambda_vector = execute_info.lambda_chunk.data[0];

				FUNCTION_FUNCTOR::AppendResult(result, lambda_vector, elem_cnt, result_entries, list_filter_info,
				                               execute_info);
				elem_cnt = 0;
			}

			// FIXME: reuse same selection vector for inconstant rows
			// adjust indexes for slicing
			child_info.sel.set_index(elem_cnt, list_entry.offset + child_idx);
			for (auto &entry : mutable_column_infos) {
				entry.get().sel.set_index(elem_cnt, row_idx);
			}

			// set the index vector
			if (info.has_index) {
				index_vector.SetValue(elem_cnt, Value::BIGINT(NumericCast<int64_t>(child_idx + 1)));
			}

			elem_cnt++;
		}
	}

	execute_info.lambda_chunk.Reset();
	ExecuteExpression(elem_cnt, child_info, info.column_infos, index_vector, execute_info);
	auto &lambda_vector = execute_info.lambda_chunk.data[0];

	FUNCTION_FUNCTOR::AppendResult(result, lambda_vector, elem_cnt, result_entries, list_filter_info, execute_info);

	if (info.is_all_constant && !info.is_volatile) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}